

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O1

QAbstractFileEngine * __thiscall QFilePrivate::engine(QFilePrivate *this)

{
  QAbstractFileEngine *pQVar1;
  _func_int **pp_Var2;
  long in_FS_OFFSET;
  QAbstractFileEngine local_20;
  
  local_20.d_ptr.d = *(QAbstractFileEnginePrivate **)(in_FS_OFFSET + 0x28);
  if ((this->super_QFileDevicePrivate).fileEngine._M_t.
      super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
      super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
      super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl == (QAbstractFileEngine *)0x0
     ) {
    QAbstractFileEngine::create(&local_20,&this->fileName);
    pp_Var2 = local_20._vptr_QAbstractFileEngine;
    local_20._vptr_QAbstractFileEngine = (_func_int **)0x0;
    pQVar1 = (this->super_QFileDevicePrivate).fileEngine._M_t.
             super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
             _M_t.
             super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
             .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
    (this->super_QFileDevicePrivate).fileEngine._M_t.
    super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
    super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
    super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
         (QAbstractFileEngine *)pp_Var2;
    if (pQVar1 != (QAbstractFileEngine *)0x0) {
      (*pQVar1->_vptr_QAbstractFileEngine[1])();
    }
    if ((QAbstractFileEngine *)local_20._vptr_QAbstractFileEngine != (QAbstractFileEngine *)0x0) {
      (*(*(_func_int ***)local_20._vptr_QAbstractFileEngine)[1])();
    }
  }
  if (*(QAbstractFileEnginePrivate **)(in_FS_OFFSET + 0x28) == local_20.d_ptr.d) {
    return (this->super_QFileDevicePrivate).fileEngine._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractFileEngine *QFilePrivate::engine() const
{
    if (!fileEngine)
        fileEngine = QAbstractFileEngine::create(fileName);
    return fileEngine.get();
}